

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseNAT.cpp
# Opt level: O1

void __thiscall
tonk::gateway::StateMachine::BeginGatewayXMLRequest(StateMachine *this,int gatewayIndex)

{
  ostringstream *this_00;
  int *piVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_01;
  pointer pGVar2;
  long lVar3;
  pointer pcVar4;
  AsioHost *request_00;
  undefined8 uVar5;
  ostream *poVar6;
  _Alloc_hider _Var7;
  OutputWorker *this_02;
  Result result;
  shared_ptr<tonk::gateway::HTTPRequester> requester;
  string request;
  ostringstream oss;
  undefined1 local_430 [16];
  undefined1 local_420 [8];
  undefined1 local_418 [16];
  undefined1 auStack_408 [16];
  undefined1 local_3f8 [40];
  __uniq_ptr_impl<asio::io_context::strand,_std::default_delete<asio::io_context::strand>_>
  local_3d0;
  char local_3c8 [16];
  string local_3b8 [8];
  unsigned_long local_3b0;
  char local_3a8 [24];
  pointer local_390;
  AsioHost *local_388;
  _Alloc_hider _Stack_380;
  unsigned_long local_378;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_370;
  _Any_data _Stack_360;
  undefined1 local_350 [24];
  undefined1 local_338 [24];
  undefined1 *local_320;
  undefined8 local_318;
  undefined1 local_310 [16];
  undefined1 *local_300;
  size_t local_2f8;
  undefined1 local_2f0 [8];
  pointer pcStack_2e8;
  uint16_t local_2e0;
  pointer local_2d8;
  AsioHost *local_2d0;
  pointer puStack_2c8;
  unsigned_long local_2c0;
  size_type local_2b8;
  undefined4 uStack_2b0;
  undefined4 uStack_2ac;
  undefined4 uStack_2a8;
  undefined8 uStack_2a4;
  _Any_data local_1c8;
  undefined1 local_1b8 [16];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  piVar1 = &(this->GatewayEndpoints).
            super__Vector_base<tonk::gateway::GatewayEndpoint,_std::allocator<tonk::gateway::GatewayEndpoint>_>
            ._M_impl.super__Vector_impl_data._M_start[gatewayIndex].RetriesRemaining;
  *piVar1 = *piVar1 + -1;
  local_430._8_8_ = operator_new(0x1a8,(nothrow_t *)&std::nothrow);
  if ((HTTPRequester *)local_430._8_8_ == (HTTPRequester *)0x0) {
    local_430._8_8_ = (HTTPRequester *)0x0;
  }
  else {
    (((HTTPRequester *)local_430._8_8_)->BodyContent).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ((HTTPRequester *)local_430._8_8_)->ContentLength = 0;
    *(undefined8 *)&((HTTPRequester *)local_430._8_8_)->HTTPStatusCode = 0;
    (((HTTPRequester *)local_430._8_8_)->Socket_TCP_Control)._M_t.
    super___uniq_ptr_impl<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_std::default_delete<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>_*,_std::default_delete<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>_>_>
    .
    super__Head_base<0UL,_asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>_*,_false>
    ._M_head_impl =
         (basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_> *)0x0;
    (((HTTPRequester *)local_430._8_8_)->TCPStreamBuf_Control)._M_t.
    super___uniq_ptr_impl<asio::basic_streambuf<std::allocator<char>_>,_std::default_delete<asio::basic_streambuf<std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_asio::basic_streambuf<std::allocator<char>_>_*,_std::default_delete<asio::basic_streambuf<std::allocator<char>_>_>_>
    .super__Head_base<0UL,_asio::basic_streambuf<std::allocator<char>_>_*,_false>._M_head_impl =
         (basic_streambuf<std::allocator<char>_> *)0x0;
    *(undefined8 *)&((HTTPRequester *)local_430._8_8_)->AsyncRefs = 0;
    ((HTTPRequester *)local_430._8_8_)->StartUsec = 0;
    *(undefined8 *)&((HTTPRequester *)local_430._8_8_)->Done = 0;
    (((HTTPRequester *)local_430._8_8_)->TCPStreamBuf).buffer_.
    super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    (((HTTPRequester *)local_430._8_8_)->TCPStreamBuf).buffer_.
    super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    (((HTTPRequester *)local_430._8_8_)->TCPStreamBuf).buffer_.
    super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    (((HTTPRequester *)local_430._8_8_)->BodyContent).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (((HTTPRequester *)local_430._8_8_)->BodyContent).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (((HTTPRequester *)local_430._8_8_)->BodyContent).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ((HTTPRequester *)local_430._8_8_)->ContentLength = 0;
    *(undefined8 *)&((HTTPRequester *)local_430._8_8_)->HTTPStatusCode = 0;
    *(undefined8 *)&(((HTTPRequester *)local_430._8_8_)->TCPStreamBuf).field_0x8 = 0;
    *(undefined8 *)&(((HTTPRequester *)local_430._8_8_)->TCPStreamBuf).field_0x10 = 0;
    *(undefined8 *)&(((HTTPRequester *)local_430._8_8_)->TCPStreamBuf).field_0x18 = 0;
    *(undefined8 *)&(((HTTPRequester *)local_430._8_8_)->TCPStreamBuf).field_0x20 = 0;
    *(undefined8 *)&(((HTTPRequester *)local_430._8_8_)->TCPStreamBuf).field_0x28 = 0;
    *(undefined8 *)&(((HTTPRequester *)local_430._8_8_)->TCPStreamBuf).field_0x30 = 0;
    *(undefined8 *)&(((HTTPRequester *)local_430._8_8_)->TCPStreamBuf).field_0x38 = 0;
    (((HTTPRequester *)local_430._8_8_)->TCPStreamBuf).max_size_ = 0;
    (((HTTPRequester *)local_430._8_8_)->Request).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(((HTTPRequester *)local_430._8_8_)->Request).field_2 + 8) = 0;
    *(undefined8 *)&(((HTTPRequester *)local_430._8_8_)->Callback).super__Function_base._M_functor =
         0;
    *(undefined8 *)
     ((long)&(((HTTPRequester *)local_430._8_8_)->Callback).super__Function_base._M_functor + 8) = 0
    ;
    (((HTTPRequester *)local_430._8_8_)->Callback).super__Function_base._M_manager =
         (_Manager_type)0x0;
    (((HTTPRequester *)local_430._8_8_)->Callback)._M_invoker = (_Invoker_type)0x0;
    (((HTTPRequester *)local_430._8_8_)->Socket_TCP)._M_t.
    super___uniq_ptr_impl<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_std::default_delete<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>_*,_std::default_delete<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>_>_>
    .
    super__Head_base<0UL,_asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>_*,_false>
    ._M_head_impl =
         (basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_> *)0x0;
    *(undefined8 *)&((HTTPRequester *)local_430._8_8_)->TCPStreamBuf = 0;
    (((HTTPRequester *)local_430._8_8_)->URL).IPAddr.ipv6_address_.scope_id_ = 0;
    *(undefined8 *)&(((HTTPRequester *)local_430._8_8_)->URL).TCPEndpoint.impl_.data_ = 0;
    *(undefined8 *)((long)&(((HTTPRequester *)local_430._8_8_)->URL).TCPEndpoint.impl_.data_ + 8) =
         0;
    *(undefined8 *)((long)&(((HTTPRequester *)local_430._8_8_)->URL).TCPEndpoint.impl_.data_ + 0x10)
         = 0;
    *(undefined8 *)((long)&(((HTTPRequester *)local_430._8_8_)->URL).TCPEndpoint.impl_.data_ + 0x18)
         = 0;
    ((HTTPRequester *)local_430._8_8_)->Host = (AsioHost *)0x0;
    (((HTTPRequester *)local_430._8_8_)->Request)._M_dataplus._M_p = (pointer)0x0;
    (((HTTPRequester *)local_430._8_8_)->Request)._M_string_length = 0;
    (((HTTPRequester *)local_430._8_8_)->URL).IP._M_dataplus._M_p = (pointer)0x0;
    (((HTTPRequester *)local_430._8_8_)->URL).IP._M_string_length = 0;
    (((HTTPRequester *)local_430._8_8_)->URL).IP.field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(((HTTPRequester *)local_430._8_8_)->URL).IP.field_2 + 8) = 0;
    *(undefined8 *)&(((HTTPRequester *)local_430._8_8_)->URL).Port = 0;
    (((HTTPRequester *)local_430._8_8_)->URL).IPAddr.type_ = ipv4;
    (((HTTPRequester *)local_430._8_8_)->URL).IPAddr.ipv4_address_ = (in4_addr_type)0x0;
    *(undefined8 *)&(((HTTPRequester *)local_430._8_8_)->URL).IPAddr.ipv6_address_.addr_.__in6_u = 0
    ;
    *(undefined8 *)
     ((long)&(((HTTPRequester *)local_430._8_8_)->URL).IPAddr.ipv6_address_.addr_.__in6_u + 8) = 0;
    (((HTTPRequester *)local_430._8_8_)->URL).FullURL._M_dataplus._M_p = (pointer)0x0;
    (((HTTPRequester *)local_430._8_8_)->URL).FullURL._M_string_length = 0;
    (((HTTPRequester *)local_430._8_8_)->URL).FullURL.field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(((HTTPRequester *)local_430._8_8_)->URL).FullURL.field_2 + 8) = 0;
    (((HTTPRequester *)local_430._8_8_)->URL).XMLPath._M_dataplus._M_p = (pointer)0x0;
    (((HTTPRequester *)local_430._8_8_)->URL).XMLPath._M_string_length = 0;
    (((HTTPRequester *)local_430._8_8_)->URL).XMLPath.field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(((HTTPRequester *)local_430._8_8_)->URL).XMLPath.field_2 + 8) = 0;
    HTTPRequester::HTTPRequester((HTTPRequester *)local_430._8_8_);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<tonk::gateway::HTTPRequester*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_420,
             (HTTPRequester *)local_430._8_8_);
  if ((element_type *)local_430._8_8_ != (element_type *)0x0) {
    pGVar2 = (this->GatewayEndpoints).
             super__Vector_base<tonk::gateway::GatewayEndpoint,_std::allocator<tonk::gateway::GatewayEndpoint>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_3f8._0_8_ = local_3f8 + 0x10;
    lVar3 = *(long *)&pGVar2[gatewayIndex].URL.FullURL._M_dataplus;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_3f8,lVar3,pGVar2[gatewayIndex].URL.FullURL._M_string_length + lVar3);
    local_3f8._32_8_ = local_3c8;
    pcVar4 = pGVar2[gatewayIndex].URL.XMLPath._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_3f8 + 0x20),pcVar4,
               pcVar4 + pGVar2[gatewayIndex].URL.XMLPath._M_string_length);
    local_3b8 = (string  [8])local_3a8;
    pcVar4 = pGVar2[gatewayIndex].URL.IP._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              (local_3b8,pcVar4,pcVar4 + pGVar2[gatewayIndex].URL.IP._M_string_length);
    local_3a8._16_2_ = pGVar2[gatewayIndex].URL.Port;
    local_390 = *(pointer *)&pGVar2[gatewayIndex].URL.IPAddr;
    local_388 = *(AsioHost **)&pGVar2[gatewayIndex].URL.IPAddr.ipv6_address_.addr_.__in6_u;
    _Stack_380._M_p = *(pointer *)((long)&pGVar2[gatewayIndex].URL.IPAddr.ipv6_address_ + 8);
    local_378 = *(unsigned_long *)((long)&pGVar2[gatewayIndex].URL.IPAddr.ipv6_address_ + 0x10);
    aStack_370._M_allocated_capacity =
         *(undefined8 *)&pGVar2[gatewayIndex].URL.TCPEndpoint.impl_.data_;
    uVar5 = *(undefined8 *)((long)&pGVar2[gatewayIndex].URL.TCPEndpoint.impl_ + 8);
    _Stack_360._4_8_ = *(undefined8 *)((long)&pGVar2[gatewayIndex].URL.TCPEndpoint.impl_ + 0x14);
    _Stack_360._0_4_ =
         (undefined4)
         ((ulong)*(undefined8 *)((long)&pGVar2[gatewayIndex].URL.TCPEndpoint.impl_ + 0xc) >> 0x20);
    aStack_370._8_4_ = (undefined4)uVar5;
    aStack_370._12_4_ = (undefined4)((ulong)uVar5 >> 0x20);
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"GET /",5);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)local_3f8._32_8_,
                        (long)local_3d0._M_t.
                              super__Tuple_impl<0UL,_asio::io_context::strand_*,_std::default_delete<asio::io_context::strand>_>
                              .super__Head_base<0UL,_asio::io_context::strand_*,_false>._M_head_impl
                       );
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," HTTP/1.1\r\n",0xb);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Host: ",6);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)local_3b8,local_3b0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\r\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "Accept: text/html,application/xhtml+xml,application/xml\r\n\r\n",0x3b);
    std::__cxx11::stringbuf::str();
    uVar5 = local_430._8_8_;
    request_00 = this->Host;
    local_350._16_8_ = (long)local_338 + 8;
    local_350._0_8_ = this;
    local_350._8_4_ = gatewayIndex;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_350 + 0x10),local_3f8._0_8_,
               (pointer)(local_3f8._8_8_ + local_3f8._0_8_));
    local_320 = local_310;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_320,local_3f8._32_8_,
               (char *)((long)local_3d0._M_t.
                              super__Tuple_impl<0UL,_asio::io_context::strand_*,_std::default_delete<asio::io_context::strand>_>
                              .super__Head_base<0UL,_asio::io_context::strand_*,_false>._M_head_impl
                       + local_3f8._32_8_));
    local_300 = local_2f0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_300,local_3b8,(char *)(local_3b0 + (long)local_3b8));
    local_2e0._0_1_ = local_3a8[0x10];
    local_2e0._1_1_ = local_3a8[0x11];
    local_2d8 = local_390;
    local_2d0 = local_388;
    puStack_2c8 = (pointer)_Stack_380._M_p;
    local_2c0 = local_378;
    local_2b8 = aStack_370._M_allocated_capacity;
    uStack_2b0 = aStack_370._8_4_;
    uStack_2ac = aStack_370._12_4_;
    uStack_2a8 = _Stack_360._0_4_;
    uStack_2a4 = _Stack_360._4_8_;
    _local_418 = (string)(ZEXT832(0) << 0x20);
    _Var7._M_p = (pointer)operator_new(0xb8);
    *(undefined4 *)(_Var7._M_p + 8) = local_350._8_4_;
    *(undefined8 *)_Var7._M_p = local_350._0_8_;
    *(pointer *)(_Var7._M_p + 0x10) = _Var7._M_p + 0x20;
    if (local_350._16_8_ == (long)local_338 + 8) {
      *(ulong *)(_Var7._M_p + 0x20) = CONCAT71(local_338._9_7_,local_338[8]);
      *(undefined8 *)(_Var7._M_p + 0x28) = local_338._16_8_;
    }
    else {
      *(undefined8 *)(_Var7._M_p + 0x10) = local_350._16_8_;
      *(ulong *)(_Var7._M_p + 0x20) = CONCAT71(local_338._9_7_,local_338[8]);
    }
    *(undefined8 *)(_Var7._M_p + 0x18) = local_338._0_8_;
    local_338._0_8_ = 0;
    local_338[8] = 0;
    *(pointer *)(_Var7._M_p + 0x30) = _Var7._M_p + 0x40;
    if (local_320 == local_310) {
      *(ulong *)(_Var7._M_p + 0x40) = CONCAT71(local_310._1_7_,local_310[0]);
      *(undefined8 *)(_Var7._M_p + 0x48) = local_310._8_8_;
    }
    else {
      *(undefined1 **)(_Var7._M_p + 0x30) = local_320;
      *(ulong *)(_Var7._M_p + 0x40) = CONCAT71(local_310._1_7_,local_310[0]);
    }
    _Var7._M_p[0x38] = (undefined1)local_318;
    _Var7._M_p[0x39] = local_318._1_1_;
    _Var7._M_p[0x3a] = local_318._2_1_;
    _Var7._M_p[0x3b] = local_318._3_1_;
    _Var7._M_p[0x3c] = local_318._4_1_;
    _Var7._M_p[0x3d] = local_318._5_1_;
    _Var7._M_p[0x3e] = local_318._6_1_;
    _Var7._M_p[0x3f] = local_318._7_1_;
    local_318 = 0;
    local_310[0] = 0;
    *(pointer *)(_Var7._M_p + 0x50) = _Var7._M_p + 0x60;
    if (local_300 == local_2f0) {
      *(ulong *)(_Var7._M_p + 0x60) = CONCAT71(local_2f0._1_7_,local_2f0[0]);
      *(pointer *)(_Var7._M_p + 0x68) = pcStack_2e8;
    }
    else {
      *(undefined1 **)(_Var7._M_p + 0x50) = local_300;
      *(ulong *)(_Var7._M_p + 0x60) = CONCAT71(local_2f0._1_7_,local_2f0[0]);
    }
    *(size_t *)(_Var7._M_p + 0x58) = local_2f8;
    local_2f8 = 0;
    local_2f0[0] = 0;
    *(uint16_t *)(_Var7._M_p + 0x70) = local_2e0;
    *(pointer *)(_Var7._M_p + 0x78) = local_2d8;
    *(AsioHost **)(_Var7._M_p + 0x80) = local_388;
    *(pointer *)(_Var7._M_p + 0x88) = _Stack_380._M_p;
    *(unsigned_long *)(_Var7._M_p + 0x90) = local_2c0;
    *(ulong *)(_Var7._M_p + 0xa4) = CONCAT44(_Stack_360._0_4_,aStack_370._12_4_);
    *(undefined8 *)(_Var7._M_p + 0xac) = _Stack_360._4_8_;
    *(size_type *)(_Var7._M_p + 0x98) = aStack_370._M_allocated_capacity;
    *(ulong *)(_Var7._M_p + 0xa0) = CONCAT44(aStack_370._12_4_,aStack_370._8_4_);
    local_418._0_8_ = _Var7._M_p;
    auStack_408._0_8_ =
         std::
         _Function_handler<void_(const_tonk::Result_&,_unsigned_int,_const_char_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseNAT.cpp:1071:9)>
         ::_M_manager;
    auStack_408._8_8_ =
         std::
         _Function_handler<void_(const_tonk::Result_&,_unsigned_int,_const_char_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseNAT.cpp:1071:9)>
         ::_M_invoke;
    local_350._16_8_ = (long)local_338 + 8;
    local_320 = local_310;
    local_300 = local_2f0;
    HTTPRequester::Begin
              ((HTTPRequester *)local_430,(ParsedURL *)uVar5,(AsioHost *)local_3f8,
               (string *)request_00,(HTTPCallback *)&local_1c8);
    if ((code *)auStack_408._0_8_ != (code *)0x0) {
      (*(code *)auStack_408._0_8_)(local_418,local_418,3);
    }
    if (local_300 != local_2f0) {
      operator_delete(local_300);
    }
    if (local_320 != local_310) {
      operator_delete(local_320);
    }
    if ((basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_> *)
        local_350._16_8_ !=
        (basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_> *)
        (local_338 + 8)) {
      operator_delete((void *)local_350._16_8_);
    }
    if ((ErrorResult *)local_430._0_8_ == (ErrorResult *)0x0) {
      this_01 = &(this->GatewayEndpoints).
                 super__Vector_base<tonk::gateway::GatewayEndpoint,_std::allocator<tonk::gateway::GatewayEndpoint>_>
                 ._M_impl.super__Vector_impl_data._M_start[gatewayIndex].Requester.
                 super___shared_ptr<tonk::gateway::HTTPRequester,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount;
      ((__shared_ptr<tonk::gateway::HTTPRequester,_(__gnu_cxx::_Lock_policy)2> *)(this_01 + -1))->
      _M_ptr = (element_type *)local_430._8_8_;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (this_01,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_420);
    }
    else {
      Result::ToJson_abi_cxx11_((string *)local_418,(Result *)local_430);
      if (DAT_001bde60 < 5) {
        this_00 = (ostringstream *)(local_350 + 0x10);
        local_350._0_8_ = ModuleLogger;
        local_350._8_4_ = Error;
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,DAT_001bde90,DAT_001bde98);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"Failed to start web request: ",0x1d);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,(char *)local_418._0_8_,local_418._8_8_);
        this_02 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(this_02,(LogStringBuffer *)local_350);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        std::ios_base::~ios_base((ios_base *)&local_2d0);
      }
      if ((undefined1 *)local_418._0_8_ != local_418 + 0x10) {
        operator_delete((void *)local_418._0_8_);
      }
    }
    Result::~Result((Result *)local_430);
    if ((undefined1 *)local_1c8._M_unused._0_8_ != local_1b8) {
      operator_delete(local_1c8._M_unused._M_object);
    }
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    if (local_3b8 != (string  [8])local_3a8) {
      operator_delete((void *)local_3b8);
    }
    if ((char *)local_3f8._32_8_ != local_3c8) {
      operator_delete((void *)local_3f8._32_8_);
    }
    if ((undefined1 *)local_3f8._0_8_ != local_3f8 + 0x10) {
      operator_delete((void *)local_3f8._0_8_);
    }
  }
  if (local_420 != (undefined1  [8])0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_420);
  }
  return;
}

Assistant:

void StateMachine::BeginGatewayXMLRequest(int gatewayIndex)
{
    // Decrement retry count
    GatewayEndpoints[gatewayIndex].RetriesRemaining--;

    std::shared_ptr<HTTPRequester> requester = MakeSharedNoThrow<HTTPRequester>();
    if (!requester) {
        return;
    }

    ParsedURL url = GatewayEndpoints[gatewayIndex].URL;

    std::ostringstream oss;
    oss << "GET /" << url.XMLPath << " HTTP/1.1\r\n";
    oss << "Host: " << url.IP << ":" << url.Port << "\r\n";
    oss << "Accept: text/html,application/xhtml+xml,application/xml\r\n\r\n";
    std::string request = oss.str();

    Result result = requester->Begin(
        url,
        Host,
        request,
        [this, gatewayIndex, url](
            const Result& result,
            unsigned code,
            const char* response,
            unsigned bytes)
    {
        if (result.IsFail()) {
            ModuleLogger.Error("Request for XML description failed: ", result.ToJson());
            return;
        }

        // Stop trying if we got a response
        this->GatewayEndpoints[gatewayIndex].RetriesRemaining = 0;

        // Request is now considered completed
        this->GatewayEndpoints[gatewayIndex].Completed = true;

        // If HTTP response code was not 200 OK:
        if (code != 200) {
            ModuleLogger.Error("Request for XML description failed. Server returned error code: ", code);
            return;
        }

        // Parse XML response
        ParsedXML xml;
        Result parseResult = xml.Parse(response, bytes);
        if (parseResult.IsFail()) {
            ModuleLogger.Error("Failed to parse XML: ", parseResult.ToJson());
            return;
        }

        // Handle response
        this->OnXMLResponse(url, xml);
    });

    if (result.IsFail()) {
        ModuleLogger.Error("Failed to start web request: ", result.ToJson());
        return;
    }

    GatewayEndpoints[gatewayIndex].Requester = requester;
}